

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

void __thiscall ON_LineCurve::ON_LineCurve(ON_LineCurve *this,ON_2dPoint *a,ON_2dPoint *b)

{
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  double local_68;
  double len;
  double dStack_58;
  double local_50;
  ON_3dPoint local_38;
  ON_2dPoint *local_20;
  ON_2dPoint *b_local;
  ON_2dPoint *a_local;
  ON_LineCurve *this_local;
  
  local_20 = b;
  b_local = a;
  a_local = (ON_2dPoint *)this;
  ON_Curve::ON_Curve(&this->super_ON_Curve);
  (this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b71b18;
  ON_3dPoint::ON_3dPoint(&local_38,b_local);
  ON_3dPoint::ON_3dPoint((ON_3dPoint *)&len,local_20);
  from_pt.y = local_38.y;
  from_pt.x = local_38.x;
  from_pt.z = local_38.z;
  to_pt.y = dStack_58;
  to_pt.x = len;
  to_pt.z = local_50;
  ON_Line::ON_Line(&this->m_line,from_pt,to_pt);
  ON_Interval::ON_Interval(&this->m_t);
  this->m_dim = 2;
  local_68 = ON_Line::Length(&this->m_line);
  if (local_68 <= 2.3283064365386963e-10) {
    local_68 = 1.0;
  }
  ON_Interval::Set(&this->m_t,0.0,local_68);
  return;
}

Assistant:

ON_LineCurve::ON_LineCurve(const ON_2dPoint& a,const ON_2dPoint& b)
  : m_line(ON_3dPoint(a),ON_3dPoint(b))
  , m_dim(2)
{
  double len = m_line.Length();
  if ( len <= ON_ZERO_TOLERANCE )
    len = 1.0;
  m_t.Set(0.0,len);
}